

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

char * canonical_charset_name(char *charset)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  char cVar6;
  char cs [16];
  undefined4 local_28;
  char cStack_24;
  undefined1 uStack_23;
  undefined2 uStack_22;
  char local_20;
  
  if (charset != (char *)0x0) {
    cVar6 = *charset;
    pcVar5 = charset;
    if ((cVar6 != '\0') && (sVar2 = strlen(charset), sVar2 < 0x10)) {
      lVar1 = 0;
      do {
        lVar3 = lVar1;
        cVar4 = cVar6 + -0x20;
        if (0x19 < (byte)(cVar6 + 0x9fU)) {
          cVar4 = cVar6;
        }
        *(char *)((long)&local_28 + lVar3) = cVar4;
        cVar6 = charset[lVar3 + 1];
        lVar1 = lVar3 + 1;
      } while (cVar6 != '\0');
      *(undefined1 *)((long)&local_28 + lVar3 + 1) = 0;
      pcVar5 = "UTF-8";
      if ((CONCAT11(uStack_23,cStack_24) != 0x38 || local_28 != 0x2d465455) &&
         (cStack_24 != '\0' || local_28 != 0x38465455)) {
        lVar1 = CONCAT26(uStack_22,CONCAT15(uStack_23,CONCAT14(cStack_24,local_28)));
        if (lVar1 == 0x45423631465455 || local_20 == '\0' && lVar1 == 0x454236312d465455) {
          pcVar5 = "UTF-16BE";
        }
        else if (lVar1 == 0x454c3631465455 ||
                 local_20 == '\0' &&
                 CONCAT26(uStack_22,CONCAT15(uStack_23,CONCAT14(cStack_24,local_28))) ==
                 0x454c36312d465455) {
          pcVar5 = "UTF-16LE";
        }
        else {
          pcVar5 = charset;
          if (CONCAT11(uStack_23,cStack_24) == 0x32 && local_28 == 0x33395043) {
            pcVar5 = "CP932";
          }
        }
      }
    }
    return pcVar5;
  }
  return (char *)0x0;
}

Assistant:

static const char *
canonical_charset_name(const char *charset)
{
	char cs[16];
	char *p;
	const char *s;

	if (charset == NULL || charset[0] == '\0'
	    || strlen(charset) > 15)
		return (charset);

	/* Copy name to uppercase. */
	p = cs;
	s = charset;
	while (*s) {
		char c = *s++;
		if (c >= 'a' && c <= 'z')
			c -= 'a' - 'A';
		*p++ = c;
	}
	*p++ = '\0';

	if (strcmp(cs, "UTF-8") == 0 ||
	    strcmp(cs, "UTF8") == 0)
		return ("UTF-8");
	if (strcmp(cs, "UTF-16BE") == 0 ||
	    strcmp(cs, "UTF16BE") == 0)
		return ("UTF-16BE");
	if (strcmp(cs, "UTF-16LE") == 0 ||
	    strcmp(cs, "UTF16LE") == 0)
		return ("UTF-16LE");
	if (strcmp(cs, "CP932") == 0)
		return ("CP932");
	return (charset);
}